

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O1

decNumber_conflict * decNumberLogB(decNumber_conflict *res,decNumber_conflict *rhs,decContext *set)

{
  int iVar1;
  int iVar2;
  uint32_t uin;
  uint32_t uVar3;
  uint32_t status;
  uint32_t local_1c;
  
  local_1c = 0;
  if ((rhs->bits & 0x30) == 0) {
    if ((rhs->bits & 0x40) == 0) {
      if ((rhs->lsu[0] == 0) && (rhs->digits == 1)) {
        res->digits = 1;
        res->exponent = 0;
        res->lsu[0] = 0;
        res->bits = 0xc0;
        local_1c = 2;
      }
      else {
        iVar1 = rhs->digits;
        iVar2 = rhs->exponent;
        uVar3 = (iVar1 + iVar2) - 1;
        uin = -uVar3;
        if (0 < (int)uVar3) {
          uin = uVar3;
        }
        decNumberFromUInt32(res,uin);
        if (iVar1 + iVar2 < 1) {
          res->bits = 0x80;
        }
      }
    }
    else {
      decNumberCopy(res,rhs);
      res->bits = res->bits & 0x7f;
    }
  }
  else {
    decNaNs(res,rhs,(decNumber_conflict *)0x0,set,&local_1c);
  }
  if (local_1c != 0) {
    decStatus(res,local_1c,set);
  }
  return res;
}

Assistant:

decNumber * decNumberLogB(decNumber *res, const decNumber *rhs,
			  decContext *set) {
  uInt status=0;		   /* accumulator */

  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  /* NaNs as usual; Infinities return +Infinity; 0->oops */
  if (decNumberIsNaN(rhs)) decNaNs(res, rhs, NULL, set, &status);
   else if (decNumberIsInfinite(rhs)) decNumberCopyAbs(res, rhs);
   else if (decNumberIsZero(rhs)) {
    decNumberZero(res);			/* prepare for Infinity */
    res->bits=DECNEG|DECINF;		/* -Infinity */
    status|=DEC_Division_by_zero;	/* as per 754r */
    }
   else { /* finite non-zero */
    Int ae=rhs->exponent+rhs->digits-1; /* adjusted exponent */
    decNumberFromInt32(res, ae);	/* lay it out */
    }

  if (status!=0) decStatus(res, status, set);
  return res;
  }